

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O3

string * __thiscall
LSMTree::get_abi_cxx11_(string *__return_storage_ptr__,LSMTree *this,longlong key)

{
  int iVar1;
  undefined4 extraout_var;
  bool success;
  QueryResult local_40;
  long *plVar2;
  
  iVar1 = (*(this->memory->
            super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )._vptr_Dictionary[2])(this->memory,key);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    DiskTable::get(&local_40,this->disk,key);
    if (local_40.success == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_40.data._M_dataplus._M_p,
                 local_40.data._M_dataplus._M_p + local_40.data._M_string_length);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.data._M_dataplus._M_p != &local_40.data.field_2) {
      operator_delete(local_40.data._M_dataplus._M_p,local_40.data.field_2._M_allocated_capacity + 1
                     );
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LSMTree::get(long long key) {
    auto memory_result = memory->get(key);
    if (memory_result != nullptr) {
        return *memory_result;
    } else {
        auto[success, disk_result]=disk->get(key);
        if (success) {
            return disk_result;
        } else {
            return "";
        }
    }
}